

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void sdl_audio_callback(void *client,uint8_t *stream,int len)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  int iVar4;
  size_t dst_size;
  bool bVar5;
  
  iVar4 = (int)audio_ring_buf.write - (int)audio_ring_buf.read;
  iVar1 = (int)audio_ring_buf.capacity + iVar4;
  if (audio_ring_buf.read <= audio_ring_buf.write) {
    iVar1 = iVar4;
  }
  uVar3 = audio_ring_buf.write - audio_ring_buf.read;
  if (audio_ring_buf.write < audio_ring_buf.read) {
    uVar3 = (audio_ring_buf.write - audio_ring_buf.read) + audio_ring_buf.capacity;
  }
  latency_avg = latency_avg * 0.9 + ((float)(uVar3 >> 1) / 44100.0) * 1000.0 * 0.1;
  dst_size = (size_t)len;
  if (len <= iVar1) {
    sVar2 = ring_buf_read(&audio_ring_buf,stream,dst_size);
    bVar5 = dst_size < sVar2;
    dst_size = dst_size - sVar2;
    if (bVar5 || dst_size == 0) {
      return;
    }
    stream = stream + sVar2;
  }
  memset(stream,0,dst_size);
  return;
}

Assistant:

void sdl_audio_callback(void* client, uint8_t* stream, int len)
{
    float latency = ((ring_buf_available(&audio_ring_buf) >> 1) / (float)SAMPLE_RATE) * 1000.0f;
    latency_avg = (latency_avg * 0.9f + latency * 0.1f);

    //printf("read latency: %.2f ms  avg: %.2f ms\n", latency, latency_avg);

    int available = (int)ring_buf_available(&audio_ring_buf);
    if (available >= len)
    {
        size_t read = ring_buf_read(&audio_ring_buf, stream, len);
        if (read < len)
            memset(stream + read, 0, len - read);
    }
    else
    {
        memset(stream, 0, len);
    }
}